

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

ExprPtr __thiscall mathiu::impl::operator+(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  impl *piVar3;
  bool bVar4;
  IdBlock<int> *pIVar5;
  long lVar6;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>_&>
  pIVar7;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>_&>
  pSVar8;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>_&>
  c2;
  logic_error *this_00;
  Expr *__tmp;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  *patterns_1;
  App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
  *patterns_1_00;
  Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *context_00;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  *p;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  *p_00;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  *p_01;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  *p_02;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  *p_03;
  tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&> *value;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  IdProcess idProcess;
  bool bVar9;
  ExprPtr EVar10;
  Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:110:28)>
  f_1;
  Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:110:28)>
  f;
  Id<int> ii2;
  Id<int> ii1;
  Id<int> iir;
  Id<int> iil;
  Id<int> ii4;
  Id<int> ii3;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> rest;
  ContextT context;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> coeff2;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> coeff1;
  Id<mathiu::impl::PieceWise> iPieceWise;
  Id<mathiu::impl::Sum> iSr;
  Id<mathiu::impl::Sum> iSl;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_2149;
  undefined1 local_2148 [16];
  _Head_base<1UL,_const_mathiu::impl::Expr_&,_false> local_2138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2130;
  undefined1 local_2128 [16];
  undefined1 local_2118 [16];
  undefined1 local_2108 [8];
  undefined1 auStack_2100 [24];
  undefined1 local_20e8 [16];
  undefined1 auStack_20d8 [48];
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_20a8;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  _Stack_2080;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_2058;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_2050;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_2048;
  undefined4 local_2040;
  undefined4 uStack_203c;
  undefined1 auStack_2038 [24];
  __index_type _Stack_2020;
  uint3 uStack_201f;
  undefined4 local_201c;
  undefined1 local_2018 [24];
  __index_type _Stack_2000;
  uint3 uStack_1fff;
  undefined4 local_1ffc;
  undefined1 local_1ff8;
  anon_class_1_0_00000001 *local_1ff0;
  InternalPatternT<bool> IStack_1fe8;
  undefined7 uStack_1fe7;
  undefined4 local_1fe0;
  undefined4 uStack_1fdc;
  undefined4 uStack_1fd8;
  undefined4 uStack_1fd4;
  undefined4 local_1fd0;
  int32_t iStack_1fcc;
  undefined4 uStack_1fc8;
  undefined8 uStack_1fc4;
  undefined4 local_1fbc;
  undefined1 local_1fb8;
  undefined4 local_1fb0;
  int32_t iStack_1fac;
  undefined4 uStack_1fa8;
  undefined8 uStack_1fa4;
  undefined4 local_1f9c;
  undefined1 local_1f98;
  anon_class_1_0_00000001 *local_1f90;
  InternalPatternT<bool> IStack_1f88;
  undefined7 uStack_1f87;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_1f80;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_1f78;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_1f70;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_1f68;
  impl *local_1f60;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1f58;
  byte local_1f40;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1f38;
  byte local_1f20;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1f18;
  byte local_1f00;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1ef8;
  byte local_1ee0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1ed8;
  byte local_1ec0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1eb8;
  byte local_1ea0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1e98;
  byte local_1e80;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1e78;
  byte local_1e60;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1e58;
  byte local_1e40;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1e38;
  byte local_1e20;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1e18;
  byte local_1e00;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1df8;
  byte local_1de0;
  undefined1 *local_1dd8;
  undefined1 *local_1dd0;
  undefined4 local_1dc8;
  undefined4 uStack_1dc4;
  undefined4 uStack_1dc0;
  undefined8 uStack_1dbc;
  undefined4 local_1db4;
  undefined1 local_1db0;
  undefined1 *local_1da8;
  undefined1 local_1da0;
  undefined1 *local_1d98;
  undefined1 *local_1d90;
  undefined4 local_1d88;
  undefined4 uStack_1d84;
  undefined4 uStack_1d80;
  undefined8 uStack_1d7c;
  undefined4 local_1d74;
  undefined1 local_1d70;
  undefined1 *local_1d68;
  undefined1 local_1d60;
  undefined1 local_1d58 [8];
  undefined1 auStack_1d50 [24];
  undefined1 local_1d38 [64];
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_1cf8;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  _Stack_1cd0;
  undefined1 *local_1ca8;
  undefined8 local_1ca0;
  undefined4 local_1c98;
  int32_t iStack_1c94;
  undefined4 uStack_1c90;
  undefined8 uStack_1c8c;
  undefined4 local_1c84;
  undefined1 local_1c80;
  undefined4 local_1c78;
  int32_t iStack_1c74;
  undefined4 uStack_1c70;
  undefined8 uStack_1c6c;
  undefined4 local_1c64;
  undefined1 local_1c60;
  AsPointer<mathiu::impl::Fraction> *local_1c58;
  undefined8 uStack_1c50;
  undefined1 *local_1c48;
  undefined8 local_1c40;
  undefined4 local_1c38;
  undefined4 uStack_1c34;
  undefined4 uStack_1c30;
  undefined8 uStack_1c2c;
  undefined4 local_1c24;
  undefined1 local_1c20;
  undefined4 local_1c18;
  undefined4 uStack_1c14;
  undefined4 uStack_1c10;
  undefined8 uStack_1c0c;
  undefined4 local_1c04;
  undefined1 local_1c00;
  AsPointer<mathiu::impl::Fraction> *local_1bf8;
  undefined8 uStack_1bf0;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_1be8;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::PieceWise>_*> local_1bc0;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_1bb8;
  _Variadic_union<std::monostate,_int,_int_*,_const_int_*> local_1b90;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1b88;
  byte local_1b70;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1b68;
  byte local_1b50;
  AsPointer<int> *local_1b48;
  anon_class_1_0_00000001 *paStack_1b40;
  undefined4 local_1b38;
  undefined4 uStack_1b34;
  undefined4 uStack_1b30;
  undefined8 uStack_1b2c;
  undefined4 local_1b24;
  undefined1 local_1b20;
  anon_class_1_0_00000001 *local_1b18;
  InternalPatternT<bool> IStack_1b10;
  undefined7 uStack_1b0f;
  AsPointer<mathiu::impl::Fraction> *local_1b08;
  anon_class_1_0_00000001 *paStack_1b00;
  undefined4 local_1af8;
  undefined4 uStack_1af4;
  undefined4 uStack_1af0;
  undefined8 uStack_1aec;
  undefined4 local_1ae4;
  undefined1 local_1ae0;
  undefined4 local_1ad8;
  undefined4 uStack_1ad4;
  undefined4 uStack_1ad0;
  undefined8 uStack_1acc;
  undefined4 local_1ac4;
  undefined1 local_1ac0;
  anon_class_1_0_00000001 *local_1ab8;
  InternalPatternT<bool> IStack_1ab0;
  undefined7 uStack_1aaf;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_1aa8;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_1aa0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_1a98;
  AsPointer<mathiu::impl::Fraction> *local_1a90;
  anon_class_1_0_00000001 *paStack_1a88;
  undefined4 local_1a80;
  undefined4 uStack_1a7c;
  undefined4 uStack_1a78;
  undefined8 uStack_1a74;
  undefined4 local_1a6c;
  undefined1 local_1a68;
  undefined4 local_1a60;
  undefined4 uStack_1a5c;
  undefined4 uStack_1a58;
  undefined8 uStack_1a54;
  undefined4 local_1a4c;
  undefined1 local_1a48;
  anon_class_1_0_00000001 *local_1a40;
  InternalPatternT<bool> IStack_1a38;
  undefined7 uStack_1a37;
  AsPointer<int> *local_1a30;
  anon_class_1_0_00000001 *paStack_1a28;
  undefined4 local_1a20;
  undefined4 uStack_1a1c;
  undefined4 uStack_1a18;
  undefined8 uStack_1a14;
  undefined4 local_1a0c;
  undefined1 local_1a08;
  anon_class_1_0_00000001 *local_1a00;
  InternalPatternT<bool> IStack_19f8;
  undefined7 uStack_19f7;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_19f0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_19e8;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_19e0;
  App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
  local_19d8;
  undefined1 local_1978 [68];
  undefined4 local_1934;
  undefined1 local_1930;
  AsPointer<mathiu::impl::Fraction> *local_1928;
  undefined8 uStack_1920;
  AsPointer<int> *local_1918;
  anon_class_1_0_00000001 *paStack_1910;
  undefined4 local_1908;
  undefined4 uStack_1904;
  undefined4 uStack_1900;
  undefined8 uStack_18fc;
  undefined4 local_18f4;
  undefined1 local_18f0;
  anon_class_1_0_00000001 *local_18e8;
  InternalPatternT<bool> IStack_18e0;
  undefined7 uStack_18df;
  AsPointer<int> *local_18d8;
  anon_class_1_0_00000001 *paStack_18d0;
  undefined4 local_18c8;
  undefined4 uStack_18c4;
  undefined4 uStack_18c0;
  undefined8 uStack_18bc;
  undefined4 local_18b4;
  undefined1 local_18b0;
  anon_class_1_0_00000001 *local_18a8;
  InternalPatternT<bool> IStack_18a0;
  undefined7 uStack_189f;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_1898;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_1890;
  anon_class_1_0_00000001 local_1888 [8];
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::PieceWise>_*> local_1880;
  _Variadic_union<std::monostate,_int,_int_*,_const_int_*> local_1878;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_1870;
  undefined1 local_1848 [8];
  undefined1 auStack_1840 [32];
  undefined1 local_1820 [32];
  undefined1 local_1800 [1288];
  size_t local_12f8;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_12f0;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_12c8;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_12a0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_1270;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_1240;
  Id<mathiu::impl::Sum> *local_11d8;
  _Variadic_union<std::monostate,_int,_int_*,_const_int_*> local_11d0;
  undefined1 local_11c8 [40];
  __index_type local_11a0;
  AsPointer<mathiu::impl::PieceWise> *local_1198;
  anon_class_1_0_00000001 *paStack_1190;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_1188;
  anon_class_1_0_00000001 *local_1158;
  InternalPatternT<bool> IStack_1150;
  undefined7 uStack_114f;
  AsPointer<mathiu::impl::PieceWise> *local_1148;
  anon_class_1_0_00000001 *paStack_1140;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_1138;
  anon_class_1_0_00000001 *local_1108;
  InternalPatternT<bool> IStack_1100;
  undefined7 uStack_10ff;
  AsPointer<mathiu::impl::PieceWise> *local_10f8;
  anon_class_1_0_00000001 *paStack_10f0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_10e8;
  anon_class_1_0_00000001 *local_10b8;
  InternalPatternT<bool> IStack_10b0;
  undefined7 uStack_10af;
  AsPointer<mathiu::impl::PieceWise> *local_10a8;
  anon_class_1_0_00000001 *paStack_10a0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_1098;
  anon_class_1_0_00000001 *local_1068;
  InternalPatternT<bool> IStack_1060;
  undefined7 uStack_105f;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_1058;
  Id<mathiu::impl::Sum> *local_ff0;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::PieceWise>_*> local_fe8;
  AsPointer<mathiu::impl::PieceWise> *local_fe0;
  anon_class_1_0_00000001 *paStack_fd8;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_fd0;
  anon_class_1_0_00000001 *local_fa0;
  InternalPatternT<bool> IStack_f98;
  undefined7 uStack_f97;
  Id<mathiu::impl::PieceWise> *local_f90;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::PieceWise>_*> local_f88;
  AsPointer<mathiu::impl::PieceWise> *local_f80;
  anon_class_1_0_00000001 *paStack_f78;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_f70;
  anon_class_1_0_00000001 *local_f40;
  InternalPatternT<bool> IStack_f38;
  undefined7 uStack_f37;
  Id<mathiu::impl::PieceWise> *local_f30;
  _Variadic_union<std::monostate,_int,_int_*,_const_int_*> local_f28;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_f20;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_eb8;
  Id<mathiu::impl::Sum> *local_e50;
  Id<mathiu::impl::Sum> *local_e48;
  undefined1 local_e40 [64];
  __index_type local_e00;
  App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_df8;
  App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_da0;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_d48;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_cf8;
  AsPointer<mathiu::impl::Sum> *local_ca8;
  anon_class_1_0_00000001 *paStack_ca0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_c98;
  anon_class_1_0_00000001 *local_c50;
  InternalPatternT<bool> IStack_c48;
  undefined7 uStack_c47;
  AsPointer<mathiu::impl::Sum> *local_c40;
  anon_class_1_0_00000001 *paStack_c38;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_c30;
  anon_class_1_0_00000001 *local_be8;
  InternalPatternT<bool> IStack_be0;
  undefined7 uStack_bdf;
  AsPointer<mathiu::impl::Sum> *local_bd8;
  anon_class_1_0_00000001 *paStack_bd0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_bc8;
  anon_class_1_0_00000001 *local_b80;
  InternalPatternT<bool> IStack_b78;
  undefined7 uStack_b77;
  AsPointer<mathiu::impl::Sum> *local_b70;
  anon_class_1_0_00000001 *paStack_b68;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_b60;
  anon_class_1_0_00000001 *local_b18;
  InternalPatternT<bool> IStack_b10;
  undefined7 uStack_b0f;
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  local_b08;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_a58;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_a10;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_9c8;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_980;
  undefined1 local_938 [64];
  __index_type local_8f8;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>_>
  local_8f0;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_830;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_7c8;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_760;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_6f8;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>_>
  local_690;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>_>
  local_5c0;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>_>
  local_520;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>_>
  local_480;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  local_400;
  undefined1 local_330 [72];
  undefined1 *local_2e8;
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined8 uStack_2d4;
  undefined4 local_2cc;
  undefined1 local_2c8;
  undefined1 *local_2c0;
  undefined1 local_2b8;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_2b0;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_230;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  local_190;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  local_f0;
  
  local_1848._0_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_1840._12_4_ = 0;
  auStack_1840._16_4_ = 0;
  auStack_1840._20_4_ = 0;
  auStack_1840._24_8_ = 0;
  local_1820._0_4_ = 0;
  local_1820._4_4_ = 0;
  local_1820._8_4_ = 0;
  local_1820._12_4_ = 0;
  local_1820._16_4_ = 0;
  local_1820._20_4_ = 0;
  local_938._0_4_ = 0;
  local_2118._0_8_ = lhs;
  local_2118._8_8_ = rhs;
  local_1f60 = this;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                     *)(local_938 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                     *)auStack_1840);
  local_8f8 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                       *)auStack_1840);
  local_1848._0_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_1840._12_4_ = 0;
  auStack_1840._16_4_ = 0;
  auStack_1840._20_4_ = 0;
  auStack_1840._24_8_ = 0;
  local_1820._0_4_ = 0;
  local_1820._4_4_ = 0;
  local_1820._8_4_ = 0;
  local_1820._12_4_ = 0;
  local_1820._16_4_ = 0;
  local_1820._20_4_ = 0;
  local_e40._0_4_ = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                     *)(local_e40 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                     *)auStack_1840);
  local_e00 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                       *)auStack_1840);
  local_1df8._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1df8._4_8_ = ZEXT48((uint)local_1848._0_4_);
  local_1df8._12_8_ = 0;
  local_1df8._20_4_ = 0;
  local_1de0 = 0;
  local_1e18._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1e18._4_8_ = ZEXT48((uint)local_1848._0_4_);
  local_1e18._12_8_ = 0;
  local_1e18._20_4_ = 0;
  local_1e00 = 0;
  local_1f38._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1f38._4_8_ = ZEXT48((uint)local_1848._0_4_);
  local_1f38._12_8_ = 0;
  local_1f38._20_4_ = 0;
  local_1f20 = 0;
  local_1f58._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1f58._4_8_ = ZEXT48((uint)local_1848._0_4_);
  local_1f58._12_8_ = 0;
  local_1f58._20_4_ = 0;
  local_1f40 = 0;
  local_1b68._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1b68._4_8_ = ZEXT48((uint)local_1848._0_4_);
  local_1b68._12_8_ = 0;
  local_1b68._20_4_ = 0;
  local_1b50 = 0;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1b88._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1b88._4_8_ = ZEXT48((uint)local_1848._0_4_);
  local_1b88._12_8_ = 0;
  local_1b88._20_4_ = 0;
  local_1b70 = 0;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_12c8);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_12f0);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_1870);
  local_1848._0_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_1840._12_4_ = 0;
  auStack_1840._16_4_ = 0;
  auStack_1840._20_4_ = 0;
  auStack_1840._24_8_ = 0;
  local_11c8._0_4_ = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
                     *)(local_11c8 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
                     *)auStack_1840);
  local_11a0 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
                       *)auStack_1840);
  local_2128._8_8_ = *(undefined8 *)local_2118._0_8_;
  local_2128._0_8_ = *(undefined8 *)local_2118._8_8_;
  local_1bb8.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_1bb8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_1bb8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  patterns_1 = (App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
                *)&matchit::impl::cast<bool>;
  local_1bb8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_1bb8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_1b90 = (_Variadic_union<std::monostate,_int,_int_*,_const_int_*>)local_2118._8_8_;
  local_1be8.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_1be8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_1be8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  local_1be8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_1be8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_1bc0 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>)local_2118._0_8_;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_980,(Id<mathiu::impl::Sum> *)local_938);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_6f8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)&local_980);
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_9c8,(Id<mathiu::impl::Sum> *)local_e40);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_760,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)&local_9c8);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>
            (&local_400,(impl *)&local_6f8,&local_760,patterns_1);
  matchit::impl::PatternPipable::operator|(&local_690,(PatternPipable *)&local_400,p);
  local_f20.mUnary =
       local_690.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
       ._M_head_impl.mUnary;
  local_f20.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
  ._M_head_impl.mUnary =
       local_690.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
       ._M_head_impl.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
       ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            (&local_f20.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
              ._M_head_impl.mPattern,
             &local_690.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
              ._M_head_impl.mPattern);
  local_f20.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary =
       local_690.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
       ._M_head_impl.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
       ._M_head_impl.mUnary;
  local_f20.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern =
       local_690.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
       ._M_head_impl.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
       ._M_head_impl.mPattern;
  local_f20.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl._9_7_ =
       local_690.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
       ._M_head_impl.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
       ._M_head_impl._9_7_;
  local_eb8.mUnary =
       local_690.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
       ._M_head_impl.mUnary;
  local_eb8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
  ._M_head_impl.mUnary =
       local_690.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
       ._M_head_impl.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
       ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            (&local_eb8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
              ._M_head_impl.mPattern,
             &local_690.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
              ._M_head_impl.mPattern);
  local_eb8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary =
       local_690.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
       ._M_head_impl.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
       ._M_head_impl.mUnary;
  local_eb8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern =
       local_690.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
       ._M_head_impl.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
       ._M_head_impl.mPattern;
  local_eb8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl._9_7_ =
       local_690.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
       ._M_head_impl.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
       .
       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
       ._M_head_impl._9_7_;
  local_e50 = (Id<mathiu::impl::Sum> *)local_938;
  local_e48 = (Id<mathiu::impl::Sum> *)local_e40;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_a10,(Id<mathiu::impl::Sum> *)local_938);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_7c8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)&local_a10);
  local_bd8 = local_7c8.mUnary;
  paStack_bd0 = local_7c8.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_bc8,
             &local_7c8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
              ._M_head_impl.mPattern);
  local_b80 = local_7c8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_b78 = local_7c8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_b77 = local_7c8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_b70 = local_bd8;
  paStack_b68 = paStack_bd0;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_b60,(Id<mathiu::impl::Sum> *)&local_bc8);
  local_b18 = local_b80;
  IStack_b10 = IStack_b78;
  uStack_b0f = uStack_b77;
  local_1240.mUnary = local_b70;
  local_1240.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
  ._M_head_impl.mUnary = paStack_b68;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            (&local_1240.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
              ._M_head_impl.mPattern,(Id<mathiu::impl::Sum> *)&local_b60);
  local_1240.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = local_b18;
  local_1240.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = IStack_b10;
  local_1240.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl._9_7_ = uStack_b0f;
  local_11d0 = (_Variadic_union<std::monostate,_int,_int_*,_const_int_*>)local_2118._8_8_;
  local_11d8 = (Id<mathiu::impl::Sum> *)local_938;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_a58,(Id<mathiu::impl::Sum> *)local_e40);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_830,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)&local_a58);
  local_ca8 = local_830.mUnary;
  paStack_ca0 = local_830.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_c98,
             &local_830.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
              ._M_head_impl.mPattern);
  local_c50 = local_830.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_c48 = local_830.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_c47 = local_830.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_c40 = local_ca8;
  paStack_c38 = paStack_ca0;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_c30,(Id<mathiu::impl::Sum> *)&local_c98);
  local_be8 = local_c50;
  IStack_be0 = IStack_c48;
  uStack_bdf = uStack_c47;
  local_1058.mUnary = local_c40;
  local_1058.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
  ._M_head_impl.mUnary = paStack_c38;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            (&local_1058.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
              ._M_head_impl.mPattern,(Id<mathiu::impl::Sum> *)&local_c30);
  local_1058.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = local_be8;
  local_1058.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = IStack_be0;
  local_1058.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl._9_7_ = uStack_bdf;
  local_fe8 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>)local_2118._0_8_;
  local_ff0 = (Id<mathiu::impl::Sum> *)local_e40;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1de0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1df8._M_first);
  local_1d98 = &matchit::impl::asPointer<int>;
  local_1d90 = &matchit::impl::deref;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  uStack_1d7c = 0;
  uStack_1d80 = 0;
  local_1d74 = 0;
  local_1d88 = SUB84(pIVar5,0);
  uStack_1d84 = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1d70 = 1;
  local_1d68 = &matchit::impl::cast<bool>;
  local_1d60 = 1;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1e00]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1e18._M_first);
  local_330._64_8_ = &matchit::impl::asPointer<int>;
  local_2e8 = &matchit::impl::deref;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  uStack_2d4 = 0;
  uStack_2d8._0_1_ = false;
  uStack_2d8._1_3_ = 0;
  local_2cc = 0;
  local_2e0 = SUB84(pIVar5,0);
  uStack_2dc = (undefined4)((ulong)pIVar5 >> 0x20);
  local_2c8 = 1;
  local_2c0 = &matchit::impl::cast<bool>;
  local_2b8 = 1;
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>
            (&local_2b0,(impl *)&local_1d98,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)(local_330 + 0x40),
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)0x0);
  matchit::impl::PatternPipable::operator|(&local_480,(PatternPipable *)&local_2b0,p_00);
  local_1918 = local_480.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
               ._M_head_impl.mUnary;
  paStack_1910 = local_480.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                 ._M_head_impl.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                 ._M_head_impl.mUnary;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1908 = 0;
  uStack_18fc = 0;
  uStack_1904 = local_1848._0_4_;
  uStack_1900 = 0;
  local_18f4 = 0;
  local_18f0 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_480.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
              ._M_head_impl.mPattern.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      &local_480.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                       ._M_head_impl.mPattern.mBlock);
  local_1908 = SUB84(pIVar5,0);
  uStack_1904 = (undefined4)((ulong)pIVar5 >> 0x20);
  local_18f0 = 1;
  local_18e8 = local_480.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mUnary;
  IStack_18e0 = local_480.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl.mPattern;
  uStack_18df = local_480.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl._9_7_;
  local_18d8 = local_480.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
               ._M_head_impl.mUnary;
  paStack_18d0 = local_480.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                 .
                 super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                 ._M_head_impl.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                 ._M_head_impl.mUnary;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_18c8 = 0;
  uStack_18bc = 0;
  uStack_18c4 = local_1848._0_4_;
  uStack_18c0 = 0;
  local_18b4 = 0;
  local_18b0 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_480.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
              ._M_head_impl.mPattern.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      &local_480.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                       ._M_head_impl.mPattern.mBlock);
  local_18c8 = SUB84(pIVar5,0);
  uStack_18c4 = (undefined4)((ulong)pIVar5 >> 0x20);
  local_18b0 = 1;
  local_18a8 = local_480.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mUnary;
  IStack_18a0 = local_480.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl.mPattern;
  uStack_189f = local_480.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl._9_7_;
  local_1898 = &local_1df8;
  local_1890 = &local_1e18;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1de0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1df8._M_first);
  local_1dd8 = &matchit::impl::asPointer<int>;
  local_1dd0 = &matchit::impl::deref;
  uStack_1dbc = 0;
  uStack_1dc0 = 0;
  local_1db4 = 0;
  local_1dc8 = SUB84(pIVar5,0);
  uStack_1dc4 = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1db0 = 1;
  local_1da8 = &matchit::impl::cast<bool>;
  local_1da0 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1e58._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1e58._20_4_ = 0;
  local_1e58._12_8_ = 0;
  local_1e58._4_4_ = local_1848._0_4_;
  local_1e58._8_4_ = 0;
  local_1e40 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1f40]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1f58._M_first);
  local_1e58._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar5;
  local_1e58._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1e40 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1e38._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1e38._12_8_ = 0;
  local_1e38._4_4_ = local_1848._0_4_;
  local_1e38._8_4_ = 0;
  local_1e38._20_4_ = 0;
  local_1e20 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1f20]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1f38._M_first);
  local_1e38._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar5;
  local_1e38._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1e20 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_2108._0_4_ = 0;
  local_2108._4_4_ = local_1848._0_4_;
  auStack_2100._0_4_ = 0;
  auStack_2100._4_4_ = 0;
  auStack_2100._8_4_ = 0;
  auStack_2100._12_8_ = (ulong)(uint3)auStack_2100._17_3_ << 0x28;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1e40]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1e58._M_first);
  local_2108._0_4_ = SUB84(pIVar5,0);
  local_2108._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_2100[0x10] = '\x01';
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_20e8._0_4_ = 0;
  local_20e8._4_4_ = local_1848._0_4_;
  local_20e8._8_4_ = 0;
  local_20e8._12_4_ = 0;
  auStack_20d8._0_4_ = 0;
  auStack_20d8._4_8_ = (ulong)(uint3)auStack_20d8._9_3_ << 0x28;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1e20]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1e38._M_first);
  local_20e8._0_4_ = SUB84(pIVar5,0);
  local_20e8._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_20d8[8] = '\x01';
  local_2040 = 0x20c9e1;
  uStack_203c = 0;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_2038._0_4_ = 0;
  auStack_2038._4_4_ = local_1848._0_4_;
  auStack_2038._8_4_ = 0;
  auStack_2038._12_4_ = 0;
  auStack_2038._16_4_ = 0;
  stack0xffffffffffffdfdc = (ulong)uStack_201f << 0x28;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(ulong)auStack_2100._12_8_ >> 0x20 & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_2108);
  auStack_2038._0_4_ = SUB84(pIVar5,0);
  auStack_2038._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  stack0xffffffffffffdfdc = CONCAT14('\x01',auStack_2038._20_4_);
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_2018._0_4_ = 0;
  local_2018._4_4_ = local_1848._0_4_;
  local_2018._8_4_ = 0;
  local_2018._12_4_ = 0;
  local_2018._16_4_ = 0;
  stack0xffffffffffffdffc = (ulong)uStack_1fff << 0x28;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(ulong)auStack_20d8._4_8_ >> 0x20 & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_20e8);
  local_2018._0_4_ = SUB84(pIVar5,0);
  local_2018._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  stack0xffffffffffffdffc = CONCAT14('\x01',local_2018._20_4_);
  local_1848._0_4_ = local_2040;
  local_1848._4_4_ = uStack_203c;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mUnary._0_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_1840._12_4_ = 0;
  auStack_1840._16_4_ = 0;
  auStack_1840._20_4_ = 0;
  auStack_1840._24_8_ = auStack_1840._24_8_ & 0xffffffffffffff00;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[stack0xffffffffffffdfdc >> 0x20 & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_8f0,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      auStack_2038);
  auStack_1840._0_4_ = SUB84(pIVar5,0);
  auStack_1840._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_1840[0x18] = 1;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mUnary._0_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1820._0_4_ = 0;
  local_1820._8_4_ = 0;
  local_1820._12_4_ = 0;
  local_1820._16_4_ = 0;
  local_1820._20_4_ = 0;
  local_1820[0x18] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[stack0xffffffffffffdffc >> 0x20 & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_8f0,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_2018);
  local_1820._0_4_ = SUB84(pIVar5,0);
  local_1820._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1820[0x18] = 1;
  local_1800._0_8_ = &matchit::impl::cast<bool>;
  local_1800[8] = 1;
  local_1978._0_8_ = &matchit::impl::asPointer<mathiu::impl::Fraction>;
  local_1978._8_8_ = CONCAT44(local_1848._4_4_,local_1848._0_4_);
  uStack_203c = 0;
  auStack_2038._0_4_ = 0;
  auStack_2038._4_4_ = 0;
  auStack_2038._8_4_ = 0;
  local_1978._16_4_ = 0;
  local_1978._28_8_ = 0;
  local_1978._20_4_ = local_2040;
  local_1978._24_4_ = 0;
  local_1978._36_4_ = 0;
  local_1978[0x28] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[auStack_1840._24_8_ & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_2040,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      auStack_1840);
  local_1978._16_4_ = SUB84(pIVar5,0);
  local_1978._20_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1978[0x28] = '\x01';
  uStack_203c = 0;
  auStack_2038._0_4_ = 0;
  auStack_2038._4_4_ = 0;
  auStack_2038._8_4_ = 0;
  local_1978._48_4_ = 0;
  local_1978._60_8_ = 0;
  local_1978._52_4_ = local_2040;
  local_1978._56_4_ = 0;
  local_1934 = 0;
  local_1930 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)local_1820[0x18]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_2040,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_1820);
  local_1978._48_4_ = SUB84(pIVar5,0);
  local_1978._52_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1930 = 1;
  uStack_1920 = CONCAT71(local_1800._9_7_,local_1800[8]);
  local_1928 = (AsPointer<mathiu::impl::Fraction> *)local_1800._0_8_;
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>
            (&local_190,(impl *)&local_1dd8,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)local_1978,
             (App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
              *)local_1800);
  matchit::impl::PatternPipable::operator|(&local_520,(PatternPipable *)&local_190,p_01);
  local_1a90 = local_520.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
               ._M_head_impl.mUnary;
  paStack_1a88 = local_520.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                 ._M_head_impl.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                 ._M_head_impl.mUnary;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1a80 = 0;
  uStack_1a74 = 0;
  uStack_1a7c = local_1848._0_4_;
  uStack_1a78 = 0;
  local_1a6c = 0;
  local_1a68 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_520.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
              super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
              super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_520.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                       ._M_head_impl.mPattern);
  local_1a80 = SUB84(pIVar5,0);
  uStack_1a7c = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1a68 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1a60 = 0;
  uStack_1a54 = 0;
  uStack_1a5c = local_1848._0_4_;
  uStack_1a58 = 0;
  local_1a4c = 0;
  local_1a48 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_520.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
              super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_520.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
                       super__Head_base<0UL,_matchit::impl::Id<int>,_false>);
  local_1a60 = SUB84(pIVar5,0);
  uStack_1a5c = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1a48 = 1;
  local_1a40 = local_520.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mUnary;
  IStack_1a38 = local_520.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl.mPattern;
  uStack_1a37 = local_520.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl._9_7_;
  local_1a30 = local_520.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
               ._M_head_impl.mUnary;
  paStack_1a28 = local_520.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                 .
                 super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                 ._M_head_impl.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                 ._M_head_impl.mUnary;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1a20 = 0;
  uStack_1a14 = 0;
  uStack_1a1c = local_1848._0_4_;
  uStack_1a18 = 0;
  local_1a0c = 0;
  local_1a08 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_520.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
              ._M_head_impl.mPattern.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      &local_520.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                       ._M_head_impl.mPattern.mBlock);
  local_1a20 = SUB84(pIVar5,0);
  uStack_1a1c = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1a08 = 1;
  local_1a00 = local_520.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mUnary;
  IStack_19f8 = local_520.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl.mPattern;
  uStack_19f7 = local_520.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl._9_7_;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1e98._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1e98._12_8_ = 0;
  local_1e98._4_4_ = local_1848._0_4_;
  local_1e98._8_4_ = 0;
  local_1e98._20_4_ = 0;
  local_1e80 = 0;
  local_19f0 = &local_1df8;
  local_19e8 = &local_1f58;
  local_19e0 = &local_1f38;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1f40]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1f58._M_first);
  local_1e98._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar5;
  local_1e98._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1e80 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1e78._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1e78._12_8_ = 0;
  local_1e78._4_4_ = local_1848._0_4_;
  local_1e78._8_4_ = 0;
  local_1e78._20_4_ = 0;
  local_1e60 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1f20]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1f38._M_first);
  local_1e78._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar5;
  local_1e78._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1e60 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_2108._0_4_ = 0;
  local_2108._4_4_ = local_1848._0_4_;
  auStack_2100._0_4_ = 0;
  auStack_2100._4_4_ = 0;
  auStack_2100._8_4_ = 0;
  auStack_2100._12_8_ = auStack_2100._12_8_ & 0xffffff0000000000;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1e80]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1e98._M_first);
  local_2108._0_4_ = SUB84(pIVar5,0);
  local_2108._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_2100[0x10] = '\x01';
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_20e8._0_4_ = 0;
  local_20e8._4_4_ = local_1848._0_4_;
  local_20e8._8_4_ = 0;
  local_20e8._12_4_ = 0;
  auStack_20d8._0_4_ = 0;
  auStack_20d8._4_8_ = auStack_20d8._4_8_ & 0xffffff0000000000;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1e60]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1e78._M_first);
  local_20e8._0_4_ = SUB84(pIVar5,0);
  local_20e8._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_20d8[8] = '\x01';
  local_2040 = 0x20c9e1;
  uStack_203c = 0;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_2038._0_4_ = 0;
  auStack_2038._4_4_ = local_1848._0_4_;
  auStack_2038._8_4_ = 0;
  auStack_2038._12_4_ = 0;
  auStack_2038._16_4_ = 0;
  stack0xffffffffffffdfdc = stack0xffffffffffffdfdc & 0xffffff0000000000;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(ulong)auStack_2100._12_8_ >> 0x20 & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_2108);
  auStack_2038._0_4_ = SUB84(pIVar5,0);
  auStack_2038._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  stack0xffffffffffffdfdc = CONCAT14('\x01',auStack_2038._20_4_);
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_2018._0_4_ = 0;
  local_2018._4_4_ = local_1848._0_4_;
  local_2018._8_4_ = 0;
  local_2018._12_4_ = 0;
  local_2018._16_4_ = 0;
  stack0xffffffffffffdffc = stack0xffffffffffffdffc & 0xffffff0000000000;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(ulong)auStack_20d8._4_8_ >> 0x20 & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_20e8);
  local_2018._0_4_ = SUB84(pIVar5,0);
  local_2018._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  stack0xffffffffffffdffc = CONCAT14('\x01',local_2018._20_4_);
  local_1848._0_4_ = local_2040;
  local_1848._4_4_ = uStack_203c;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mUnary._0_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_1840._12_4_ = 0;
  auStack_1840._16_4_ = 0;
  auStack_1840._20_4_ = 0;
  auStack_1840._24_8_ = auStack_1840._24_8_ & 0xffffffffffffff00;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[stack0xffffffffffffdfdc >> 0x20 & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_8f0,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      auStack_2038);
  auStack_1840._0_4_ = SUB84(pIVar5,0);
  auStack_1840._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_1840[0x18] = 1;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mUnary._0_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_8f0.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1820._0_4_ = 0;
  local_1820._8_4_ = 0;
  local_1820._12_4_ = 0;
  local_1820._16_4_ = 0;
  local_1820._20_4_ = 0;
  local_1820[0x18] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[stack0xffffffffffffdffc >> 0x20 & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_8f0,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_2018);
  local_1820._0_4_ = SUB84(pIVar5,0);
  local_1820._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1820[0x18] = 1;
  local_1800._0_8_ = &matchit::impl::cast<bool>;
  local_1800[8] = 1;
  local_1c48 = &matchit::impl::asPointer<mathiu::impl::Fraction>;
  local_1c40 = CONCAT44(local_1848._4_4_,local_1848._0_4_);
  uStack_203c = 0;
  auStack_2038._0_4_ = 0;
  auStack_2038._4_4_ = 0;
  auStack_2038._8_4_ = 0;
  local_1c38 = 0;
  uStack_1c2c = 0;
  uStack_1c34 = local_2040;
  uStack_1c30 = 0;
  local_1c24 = 0;
  local_1c20 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[auStack_1840._24_8_ & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_2040,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      auStack_1840);
  local_1c38 = SUB84(pIVar5,0);
  uStack_1c34 = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1c20 = 1;
  uStack_203c = 0;
  auStack_2038._0_4_ = 0;
  auStack_2038._4_4_ = 0;
  auStack_2038._8_4_ = 0;
  local_1c18 = 0;
  uStack_1c0c = 0;
  uStack_1c14 = local_2040;
  uStack_1c10 = 0;
  local_1c04 = 0;
  local_1c00 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)local_1820[0x18]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_2040,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_1820);
  local_1c18 = SUB84(pIVar5,0);
  uStack_1c14 = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1c00 = 1;
  uStack_1bf0 = CONCAT71(local_1800._9_7_,local_1800[8]);
  local_1bf8 = (AsPointer<mathiu::impl::Fraction> *)local_1800._0_8_;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1e00]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1e18._M_first);
  local_330._0_8_ = &matchit::impl::asPointer<int>;
  local_330._8_8_ = &matchit::impl::deref;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_330._28_8_ = 0;
  local_330._24_4_ = 0;
  local_330._36_4_ = 0;
  local_330._16_4_ = SUB84(pIVar5,0);
  local_330._20_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_330[0x28] = '\x01';
  local_330._48_8_ = &matchit::impl::cast<bool>;
  local_330[0x38] = 1;
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>
            (&local_230,(impl *)&local_1c48,
             (App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
              *)local_330,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)&matchit::impl::cast<bool>);
  matchit::impl::PatternPipable::operator|(&local_5c0,(PatternPipable *)&local_230,p_02);
  local_1b48 = local_5c0.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
               ._M_head_impl.mUnary;
  paStack_1b40 = local_5c0.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                 ._M_head_impl.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                 ._M_head_impl.mUnary;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1b38 = 0;
  uStack_1b2c = 0;
  uStack_1b34 = local_1848._0_4_;
  uStack_1b30 = 0;
  local_1b24 = 0;
  local_1b20 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_5c0.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
              ._M_head_impl.mPattern.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      &local_5c0.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                       ._M_head_impl.mPattern.mBlock);
  local_1b38 = SUB84(pIVar5,0);
  uStack_1b34 = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1b20 = 1;
  local_1b18 = local_5c0.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mUnary;
  IStack_1b10 = local_5c0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl.mPattern;
  uStack_1b0f = local_5c0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl._9_7_;
  local_1b08 = local_5c0.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
               ._M_head_impl.mUnary;
  paStack_1b00 = local_5c0.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                 .
                 super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                 ._M_head_impl.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                 ._M_head_impl.mUnary;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1af8 = 0;
  uStack_1aec = 0;
  uStack_1af4 = local_1848._0_4_;
  uStack_1af0 = 0;
  local_1ae4 = 0;
  local_1ae0 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_5c0.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
              super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
              super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_5c0.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                       ._M_head_impl.mPattern);
  local_1af8 = SUB84(pIVar5,0);
  uStack_1af4 = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1ae0 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1ad8 = 0;
  uStack_1acc = 0;
  uStack_1ad4 = local_1848._0_4_;
  uStack_1ad0 = 0;
  local_1ac4 = 0;
  local_1ac0 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_5c0.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
              super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_5c0.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
                       super__Head_base<0UL,_matchit::impl::Id<int>,_false>);
  local_1ad8 = SUB84(pIVar5,0);
  uStack_1ad4 = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1ac0 = 1;
  local_1ab8 = local_5c0.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mUnary;
  IStack_1ab0 = local_5c0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl.mPattern;
  uStack_1aaf = local_5c0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl._9_7_;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1ed8._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1ed8._12_8_ = 0;
  local_1ed8._4_4_ = local_1848._0_4_;
  local_1ed8._8_4_ = 0;
  local_1ed8._20_4_ = 0;
  local_1ec0 = 0;
  local_1aa8 = &local_1e18;
  local_1aa0 = &local_1f58;
  local_1a98 = &local_1f38;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1f40]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1f58._M_first);
  local_1ed8._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar5;
  local_1ed8._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1ec0 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1eb8._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1eb8._12_8_ = 0;
  local_1eb8._4_4_ = local_1848._0_4_;
  local_1eb8._8_4_ = 0;
  local_1eb8._20_4_ = 0;
  local_1ea0 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1f20]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1f38._M_first);
  local_1eb8._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar5;
  local_1eb8._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1ea0 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1d58._0_4_ = 0;
  auStack_1d50._4_8_ = 0;
  local_1d58._4_4_ = local_1848._0_4_;
  auStack_1d50._0_4_ = 0;
  auStack_1d50._12_4_ = 0;
  auStack_1d50[0x10] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1ec0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1ed8._M_first);
  local_1d58._0_4_ = SUB84(pIVar5,0);
  local_1d58._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_1d50[0x10] = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1d38._0_4_ = 0;
  local_1d38._12_8_ = 0;
  local_1d38._4_4_ = local_1848._0_4_;
  local_1d38._8_4_ = 0;
  local_1d38._20_4_ = 0;
  local_1d38[0x18] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1ea0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1eb8._M_first);
  local_1d38._0_4_ = SUB84(pIVar5,0);
  local_1d38._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1d38[0x18] = 1;
  local_2108._0_4_ = 0x20c9e1;
  local_2108._4_4_ = 0;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_2100._0_4_ = 0;
  auStack_2100._12_8_ = 0;
  auStack_2100._4_4_ = local_1848._0_4_;
  auStack_2100._8_4_ = 0;
  auStack_2100._20_4_ = 0;
  local_20e8._0_4_ = local_20e8._0_4_ & 0xffffff00;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)auStack_1d50[0x10]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_1d58);
  auStack_2100._0_4_ = SUB84(pIVar5,0);
  auStack_2100._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_20e8[0] = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_20e8._8_4_ = 0;
  auStack_20d8._4_8_ = 0;
  local_20e8._12_4_ = local_1848._0_4_;
  auStack_20d8._0_4_ = 0;
  auStack_20d8._12_4_ = 0;
  auStack_20d8[0x10] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)local_1d38[0x18]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_1d38);
  local_20e8._8_4_ = SUB84(pIVar5,0);
  local_20e8._12_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_20d8[0x10] = 1;
  local_1848._0_4_ = local_2108._0_4_;
  local_1848._4_4_ = local_2108._4_4_;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._0_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._4_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._8_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_1840._12_4_ = 0;
  auStack_1840._16_4_ = 0;
  auStack_1840._20_4_ = 0;
  auStack_1840._24_8_ = auStack_1840._24_8_ & 0xffffffffffffff00;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)local_20e8[0]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_b08,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      auStack_2100);
  auStack_1840._0_4_ = SUB84(pIVar5,0);
  auStack_1840._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_1840[0x18] = 1;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._0_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._4_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._8_4_ = 0;
  local_1820._0_4_ = 0;
  local_1820._8_4_ = 0;
  local_1820._12_4_ = 0;
  local_1820._16_4_ = 0;
  local_1820._20_4_ = 0;
  local_1820[0x18] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)auStack_20d8[0x10]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_b08,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      (local_20e8 + 8));
  local_1820._0_4_ = SUB84(pIVar5,0);
  local_1820._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1820[0x18] = 1;
  local_1800._0_8_ = &matchit::impl::cast<bool>;
  local_1800[8] = 1;
  local_1ca8 = &matchit::impl::asPointer<mathiu::impl::Fraction>;
  local_1ca0 = CONCAT44(local_1848._4_4_,local_1848._0_4_);
  local_2108._4_4_ = 0;
  auStack_2100._0_4_ = 0;
  auStack_2100._4_4_ = 0;
  auStack_2100._8_4_ = 0;
  local_1c98 = 0;
  uStack_1c8c = 0;
  iStack_1c94 = local_2108._0_4_;
  uStack_1c90 = 0;
  local_1c84 = 0;
  local_1c80 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[auStack_1840._24_8_ & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_2108,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      auStack_1840);
  local_1c98 = SUB84(pIVar5,0);
  iStack_1c94 = (int32_t)((ulong)pIVar5 >> 0x20);
  local_1c80 = 1;
  local_2108._4_4_ = 0;
  auStack_2100._0_4_ = 0;
  auStack_2100._4_4_ = 0;
  auStack_2100._8_4_ = 0;
  local_1c78 = 0;
  uStack_1c6c = 0;
  iStack_1c74 = local_2108._0_4_;
  uStack_1c70 = 0;
  local_1c64 = 0;
  local_1c60 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)local_1820[0x18]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_2108,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_1820);
  local_1c78 = SUB84(pIVar5,0);
  iStack_1c74 = (int32_t)((ulong)pIVar5 >> 0x20);
  local_1c60 = 1;
  uStack_1c50 = CONCAT71(local_1800._9_7_,local_1800[8]);
  local_1c58 = (AsPointer<mathiu::impl::Fraction> *)local_1800._0_8_;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1f18._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1f18._12_8_ = 0;
  local_1f18._4_4_ = local_1848._0_4_;
  local_1f18._8_4_ = 0;
  local_1f18._20_4_ = 0;
  local_1f00 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1b70]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1b88._M_first);
  local_1f18._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar5;
  local_1f18._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1f00 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1ef8._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1ef8._12_8_ = 0;
  local_1ef8._4_4_ = local_1848._0_4_;
  local_1ef8._8_4_ = 0;
  local_1ef8._20_4_ = 0;
  local_1ee0 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1b50]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1b68._M_first);
  local_1ef8._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar5;
  local_1ef8._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1ee0 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1d58._0_4_ = 0;
  auStack_1d50._4_8_ = 0;
  local_1d58._4_4_ = local_1848._0_4_;
  auStack_1d50._0_4_ = 0;
  auStack_1d50._12_4_ = 0;
  auStack_1d50[0x10] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1f00]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1f18._M_first);
  local_1d58._0_4_ = SUB84(pIVar5,0);
  local_1d58._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_1d50[0x10] = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1d38._0_4_ = 0;
  local_1d38._12_8_ = 0;
  local_1d38._4_4_ = local_1848._0_4_;
  local_1d38._8_4_ = 0;
  local_1d38._20_4_ = 0;
  local_1d38[0x18] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1ee0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1ef8._M_first);
  local_1d38._0_4_ = SUB84(pIVar5,0);
  local_1d38._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1d38[0x18] = 1;
  local_2108._0_4_ = 0x20c9e1;
  local_2108._4_4_ = 0;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_2100._0_4_ = 0;
  auStack_2100._12_8_ = 0;
  auStack_2100._4_4_ = local_1848._0_4_;
  auStack_2100._8_4_ = 0;
  auStack_2100._20_4_ = 0;
  local_20e8[0] = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)auStack_1d50[0x10]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_1d58);
  auStack_2100._0_4_ = SUB84(pIVar5,0);
  auStack_2100._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_20e8[0] = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_20e8._8_4_ = 0;
  auStack_20d8._4_8_ = 0;
  local_20e8._12_4_ = local_1848._0_4_;
  auStack_20d8._0_4_ = 0;
  auStack_20d8._12_4_ = 0;
  auStack_20d8[0x10] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)local_1d38[0x18]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_1d38);
  local_20e8._8_4_ = SUB84(pIVar5,0);
  local_20e8._12_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_20d8[0x10] = 1;
  local_1848._0_4_ = local_2108._0_4_;
  local_1848._4_4_ = local_2108._4_4_;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._0_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._4_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._8_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_1840._12_4_ = 0;
  auStack_1840._16_4_ = 0;
  auStack_1840._20_4_ = 0;
  auStack_1840._24_8_ = auStack_1840._24_8_ & 0xffffffffffffff00;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)local_20e8[0]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_b08,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      auStack_2100);
  auStack_1840._0_4_ = SUB84(pIVar5,0);
  auStack_1840._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  auStack_1840[0x18] = 1;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mUnary._4_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._0_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._4_4_ = 0;
  local_b08.
  super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._8_4_ = 0;
  local_1820._0_4_ = 0;
  local_1820._8_4_ = 0;
  local_1820._12_4_ = 0;
  local_1820._16_4_ = 0;
  local_1820._20_4_ = 0;
  local_1820[0x18] = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)auStack_20d8[0x10]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_b08,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      (local_20e8 + 8));
  local_1820._0_4_ = SUB84(pIVar5,0);
  local_1820._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1820[0x18] = 1;
  patterns_1_00 =
       (App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
        *)&matchit::impl::cast<bool>;
  local_1800._0_8_ = &matchit::impl::cast<bool>;
  local_1800[8] = 1;
  local_19d8.mUnary =
       (AsPointer<mathiu::impl::Fraction> *)&matchit::impl::asPointer<mathiu::impl::Fraction>;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)CONCAT44(local_1848._4_4_,local_1848._0_4_);
  local_2108._4_4_ = 0;
  auStack_2100._0_4_ = 0;
  auStack_2100._4_4_ = 0;
  auStack_2100._8_4_ = 0;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _12_8_ = 0;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_4_ = local_2108._0_4_;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _8_4_ = 0;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _20_4_ = 0;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[auStack_1840._24_8_ & 0xff]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_2108,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      auStack_1840);
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar5;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\x01';
  local_2108._4_4_ = 0;
  auStack_2100._0_4_ = 0;
  auStack_2100._4_4_ = 0;
  auStack_2100._8_4_ = 0;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _12_8_ = 0;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_4_ = local_2108._0_4_;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _8_4_ = 0;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _20_4_ = 0;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\0';
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[(byte)local_1820[0x18]]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_2108,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      local_1820);
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar5;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
  ._M_head_impl.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
  super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\x01';
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl._9_7_ = local_1800._9_7_;
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = (InternalPatternT<bool>)local_1800[8];
  local_19d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)local_1800._0_8_;
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>
            (&local_f0,(impl *)&local_1ca8,&local_19d8,patterns_1_00);
  matchit::impl::PatternPipable::operator|(&local_8f0,(PatternPipable *)&local_f0,p_03);
  uStack_203c = local_8f0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mUnary._4_4_;
  auStack_2038._0_4_ =
       (int32_t)local_8f0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                ._M_head_impl.mUnary;
  auStack_2038._4_4_ =
       local_8f0.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
       ._M_head_impl.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
       ._M_head_impl.mUnary._4_4_;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  auStack_2038._8_4_ = 0;
  unique0x10004708 = 0;
  auStack_2038._12_4_ = local_1848._0_4_;
  auStack_2038._16_4_ = 0;
  local_201c = 0;
  local_2018._0_4_ = local_2018._0_4_ & 0xffffff00;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_8f0.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
              super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
              super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_8f0.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                       ._M_head_impl.mPattern);
  auStack_2038._8_4_ = SUB84(pIVar5,0);
  auStack_2038._12_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_2018[0] = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_2018._8_4_ = 0;
  unique0x10004710 = 0;
  local_2018._12_4_ = local_1848._0_4_;
  local_2018._16_4_ = 0;
  local_1ffc = 0;
  local_1ff8 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_8f0.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
              super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_8f0.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
                       super__Head_base<0UL,_matchit::impl::Id<int>,_false>);
  local_2018._8_4_ = SUB84(pIVar5,0);
  local_2018._12_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
  local_1ff8 = 1;
  local_1ff0 = local_8f0.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mUnary;
  IStack_1fe8 = local_8f0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl.mPattern;
  uStack_1fe7 = local_8f0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl._9_7_;
  local_1fe0 = local_8f0.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
               ._M_head_impl.mUnary._0_4_;
  uStack_1fdc = local_8f0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mUnary._4_4_;
  uStack_1fd8 = local_8f0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                ._M_head_impl.mUnary._0_4_;
  uStack_1fd4 = local_8f0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                ._M_head_impl.mUnary._4_4_;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1fd0 = 0;
  uStack_1fc4 = 0;
  iStack_1fcc = local_1848._0_4_;
  uStack_1fc8 = 0;
  local_1fbc = 0;
  local_1fb8 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_8f0.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
              super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
              super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_8f0.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                       ._M_head_impl.mPattern);
  local_1fd0 = SUB84(pIVar5,0);
  iStack_1fcc = (int32_t)((ulong)pIVar5 >> 0x20);
  local_1fb8 = 1;
  local_1848._4_4_ = 0;
  auStack_1840._0_4_ = 0;
  auStack_1840._4_4_ = 0;
  auStack_1840._8_4_ = 0;
  local_1fb0 = 0;
  uStack_1fa4 = 0;
  iStack_1fac = local_1848._0_4_;
  uStack_1fa8 = 0;
  local_1f9c = 0;
  local_1f98 = 0;
  pIVar5 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_8f0.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
              super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1848,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_8f0.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                       .
                       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
                       super__Head_base<0UL,_matchit::impl::Id<int>,_false>);
  local_1fb0 = SUB84(pIVar5,0);
  iStack_1fac = (int32_t)((ulong)pIVar5 >> 0x20);
  local_1f98 = 1;
  local_1f90 = local_8f0.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mUnary;
  IStack_1f88 = local_8f0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl.mPattern;
  uStack_1f87 = local_8f0.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl._9_7_;
  local_1f80 = &local_1f38;
  local_1f78 = &local_1b88;
  local_1f70 = &local_1f58;
  local_1f68 = &local_1b68;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_1270,(Id<mathiu::impl::PieceWise> *)local_11c8);
  matchit::impl::as<mathiu::impl::PieceWise>::{lambda(auto:1)#1}::operator()
            (&local_cf8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::PieceWise>,
             (Id<mathiu::impl::PieceWise> *)&local_1270);
  local_10f8 = local_cf8.mUnary;
  paStack_10f0 = local_cf8.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                 ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_10e8,
             &local_cf8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
              ._M_head_impl.mPattern);
  local_10b8 = local_cf8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mUnary;
  IStack_10b0 = local_cf8.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl.mPattern;
  uStack_10af = local_cf8.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl._9_7_;
  local_10a8 = local_10f8;
  paStack_10a0 = paStack_10f0;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_1098,(Id<mathiu::impl::PieceWise> *)&local_10e8);
  local_1068 = local_10b8;
  IStack_1060 = IStack_10b0;
  uStack_105f = uStack_10af;
  local_f80 = local_10a8;
  paStack_f78 = paStack_10a0;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_f70,(Id<mathiu::impl::PieceWise> *)&local_1098);
  local_f40 = local_1068;
  IStack_f38 = IStack_1060;
  uStack_f37 = uStack_105f;
  local_f28 = (_Variadic_union<std::monostate,_int,_int_*,_const_int_*>)local_2118._8_8_;
  local_f30 = (Id<mathiu::impl::PieceWise> *)local_11c8;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_12a0,(Id<mathiu::impl::PieceWise> *)local_11c8);
  matchit::impl::as<mathiu::impl::PieceWise>::{lambda(auto:1)#1}::operator()
            (&local_d48,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::PieceWise>,
             (Id<mathiu::impl::PieceWise> *)&local_12a0);
  local_1198 = local_d48.mUnary;
  paStack_1190 = local_d48.mPattern.mPatterns.
                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                 ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_1188,
             &local_d48.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
              ._M_head_impl.mPattern);
  local_1158 = local_d48.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mUnary;
  IStack_1150 = local_d48.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl.mPattern;
  uStack_114f = local_d48.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                ._M_head_impl._9_7_;
  local_1148 = local_1198;
  paStack_1140 = paStack_1190;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_1138,(Id<mathiu::impl::PieceWise> *)&local_1188);
  local_1108 = local_1158;
  IStack_1100 = IStack_1150;
  uStack_10ff = uStack_114f;
  local_fe0 = local_1148;
  paStack_fd8 = paStack_1140;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_fd0,(Id<mathiu::impl::PieceWise> *)&local_1138);
  local_fa0 = local_1108;
  IStack_f98 = IStack_1100;
  uStack_f97 = uStack_10ff;
  local_f88 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>)local_2118._0_8_;
  local_f90 = (Id<mathiu::impl::PieceWise> *)local_11c8;
  std::
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)local_1848,(Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_12c8,
                (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_1870);
  local_da0.mUnary = coeffAndTerm;
  std::
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)&local_da0.mPattern,
                (_Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)local_1848);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)local_1820);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)local_1848);
  std::
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)local_1848,(Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_12f0,
                (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_1870);
  local_df8.mUnary = coeffAndTerm;
  std::
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)&local_df8.mPattern,
                (_Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)local_1848);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)local_1820);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)local_1848);
  std::
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::_Tuple_impl(&local_b08,&local_da0,&local_df8);
  std::
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                 *)local_1d58,&local_b08);
  std::
  _Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                 *)local_2108,
                (_Tuple_impl<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                 *)local_1d58);
  local_1880 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>)local_2118._0_8_;
  local_1878 = (_Variadic_union<std::monostate,_int,_int_*,_const_int_*>)local_2118._8_8_;
  local_2148._0_8_ = (Expr *)0x0;
  local_2148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2058 = &local_12c8;
  local_2050 = &local_12f0;
  local_2048 = &local_1870;
  memset(local_1848,0,0x558);
  lVar6 = 0x20;
  do {
    local_1848[lVar6] = 0;
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x570);
  local_12f8 = 0;
  bVar4 = less((ExprPtr *)local_2118._8_8_,(ExprPtr *)local_2118._0_8_);
  if (bVar4) {
    operator+((impl *)&local_2138,(ExprPtr *)local_2118._8_8_,(ExprPtr *)local_2118._0_8_);
    p_Var1 = p_Stack_2130;
    local_2148._0_8_ = local_2138._M_head_impl;
    uVar2 = local_2148._8_8_;
    local_2138._M_head_impl = (Expr *)0x0;
    p_Stack_2130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2148._8_8_ = p_Var1;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
    }
    if (p_Stack_2130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2130);
    }
  }
  lVar6 = 0x528;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                         *)(local_1848 + lVar6));
    lVar6 = lVar6 + -0x28;
  } while (lVar6 != -0x28);
  if (!bVar4) {
    memset(local_1848,0,0x558);
    lVar6 = 0x20;
    do {
      local_1848[lVar6] = 0;
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0x570);
    local_12f8 = 0;
    bVar4 = matchit::impl::
            matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                      ((Expr *)local_2128._8_8_,&local_1bb8,1,
                       (Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                        *)local_1848);
    uVar2 = local_2148._8_8_;
    if (bVar4) {
      local_2148._0_8_ = *(undefined8 *)local_1b90;
      p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b90 + 8))->_M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      bVar9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2148._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2148._8_8_ = p_Var1;
      if (bVar9) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
      }
    }
    lVar6 = 0x528;
    do {
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                           *)(local_1848 + lVar6));
      lVar6 = lVar6 + -0x28;
    } while (lVar6 != -0x28);
    if (!bVar4) {
      memset(local_1848,0,0x558);
      lVar6 = 0x20;
      do {
        local_1848[lVar6] = 0;
        lVar6 = lVar6 + 0x28;
      } while (lVar6 != 0x570);
      local_12f8 = 0;
      bVar4 = matchit::impl::
              matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                        ((Expr *)local_2128._0_8_,&local_1be8,1,
                         (Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          *)local_1848);
      uVar2 = local_2148._8_8_;
      if (bVar4) {
        local_2148._0_8_ = *(undefined8 *)local_1bc0;
        p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1bc0 + 8))->_M_pi;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          }
        }
        bVar9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2148._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2148._8_8_ = p_Var1;
        if (bVar9) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
      }
      lVar6 = 0x528;
      do {
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                             *)(local_1848 + lVar6));
        lVar6 = lVar6 + -0x28;
      } while (lVar6 != -0x28);
      if (!bVar4) {
        memset(local_1848,0,0x558);
        uVar2 = local_2128._0_8_;
        lVar6 = 0x20;
        do {
          local_1848[lVar6] = 0;
          lVar6 = lVar6 + 0x28;
        } while (lVar6 != 0x570);
        local_12f8 = 0;
        bVar4 = matchit::impl::
                matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                          ((Expr *)local_2128._8_8_,&local_eb8,1,
                           (Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                            *)local_1848);
        if (bVar4) {
          bVar4 = matchit::impl::
                  matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                            ((Expr *)uVar2,&local_f20,1,
                             (Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                              *)local_1848);
        }
        else {
          bVar4 = false;
        }
        idProcess = (IdProcess)bVar4;
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
                  (&local_eb8.mPattern.mPatterns.
                    super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                    .
                    super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                    .
                    super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                    ._M_head_impl.mPattern,0,idProcess);
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
                  (&local_f20.mPattern.mPatterns.
                    super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                    .
                    super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                    .
                    super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                    ._M_head_impl.mPattern,0,(uint)bVar4);
        if (idProcess != kCANCEL) {
          pIVar7 = std::
                   visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>&)_1_,matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,matchit::impl::IdBlock<mathiu::impl::Sum>*>&>
                             (&local_2149,&local_e50->mBlock);
          pSVar8 = std::
                   visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Sum,mathiu::impl::Sum*,mathiu::impl::Sum_const*>const&>
                             ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                               *)&local_2149,
                              &(pIVar7->super_IdBlockBase<mathiu::impl::Sum>).mVariant);
          pIVar7 = std::
                   visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>&)_1_,matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,matchit::impl::IdBlock<mathiu::impl::Sum>*>&>
                             (&local_2149,&local_e48->mBlock);
          c2 = std::
               visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Sum,mathiu::impl::Sum*,mathiu::impl::Sum_const*>const&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                           *)&local_2149,&(pIVar7->super_IdBlockBase<mathiu::impl::Sum>).mVariant);
          mergeSum<mathiu::impl::Sum>((impl *)&local_2138,pSVar8,c2);
          p_Var1 = p_Stack_2130;
          local_2148._0_8_ = local_2138._M_head_impl;
          uVar2 = local_2148._8_8_;
          local_2138._M_head_impl = (Expr *)0x0;
          p_Stack_2130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2148._8_8_ = p_Var1;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
          }
          if (p_Stack_2130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2130);
          }
        }
        lVar6 = 0x528;
        do {
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                               *)(local_1848 + lVar6));
          lVar6 = lVar6 + -0x28;
        } while (lVar6 != -0x28);
        if (idProcess == kCANCEL) {
          memset(local_1848,0,0x558);
          lVar6 = 0x20;
          do {
            local_1848[lVar6] = 0;
            lVar6 = lVar6 + 0x28;
          } while (lVar6 != 0x570);
          local_12f8 = 0;
          bVar4 = matchit::impl::
                  matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                            ((Expr *)local_2128._8_8_,&local_1240,1,
                             (Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                              *)local_1848);
          matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
                    (&local_1240.mPattern.mPatterns.
                      super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                      .
                      super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                      .
                      super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                      ._M_head_impl.mPattern,0,(uint)bVar4);
          if (bVar4) {
            pIVar7 = std::
                     visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>&)_1_,matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,matchit::impl::IdBlock<mathiu::impl::Sum>*>&>
                               (&local_2149,&local_11d8->mBlock);
            pSVar8 = std::
                     visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Sum,mathiu::impl::Sum*,mathiu::impl::Sum_const*>const&>
                               ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                                 *)&local_2149,
                                &(pIVar7->super_IdBlockBase<mathiu::impl::Sum>).mVariant);
            insertSum<mathiu::impl::Sum,std::shared_ptr<mathiu::impl::Expr_const>>
                      ((impl *)&local_2138,pSVar8,(shared_ptr<const_mathiu::impl::Expr> *)local_11d0
                      );
            p_Var1 = p_Stack_2130;
            local_2148._0_8_ = local_2138._M_head_impl;
            uVar2 = local_2148._8_8_;
            local_2138._M_head_impl = (Expr *)0x0;
            p_Stack_2130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_2148._8_8_ = p_Var1;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
            }
            if (p_Stack_2130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2130);
            }
          }
          lVar6 = 0x528;
          do {
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                                 *)(local_1848 + lVar6));
            lVar6 = lVar6 + -0x28;
          } while (lVar6 != -0x28);
          if (!bVar4) {
            memset(local_1848,0,0x558);
            lVar6 = 0x20;
            do {
              local_1848[lVar6] = 0;
              lVar6 = lVar6 + 0x28;
            } while (lVar6 != 0x570);
            context_00 = (Context<const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          *)local_1848;
            local_12f8 = 0;
            bVar4 = matchit::impl::
                    matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Sum_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                              ((Expr *)local_2128._0_8_,&local_1058,1,context_00);
            matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
                      (&local_1058.mPattern.mPatterns.
                        super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                        .
                        super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                        .
                        super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                        ._M_head_impl.mPattern,0,(uint)bVar4);
            if (bVar4) {
              matchit::impl::
              PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>,mathiu::impl::TEMPNAMEPLACEHOLDERVALUE(std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&)::$_4>
              ::operator+((PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>,mathiu::impl::TEMPNAMEPLACEHOLDERVALUE(std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&)::__4>
                           *)&local_2138);
              p_Var1 = p_Stack_2130;
              local_2148._0_8_ = local_2138._M_head_impl;
              uVar2 = local_2148._8_8_;
              local_2138._M_head_impl = (Expr *)0x0;
              p_Stack_2130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_2148._8_8_ = p_Var1;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
              }
              if (p_Stack_2130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2130);
              }
            }
            lVar6 = 0x528;
            do {
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_const_mathiu::impl::Sum_*,_const_int_*,_const_mathiu::impl::Fraction_*,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                                   *)(local_1848 + lVar6));
              lVar6 = lVar6 + -0x28;
            } while (lVar6 != -0x28);
            if (!bVar4) {
              bVar4 = matchit::impl::matchPatterns<$3793ad2d$>::anon_class_1_0_00000001::
                      operator()<matchit::impl::PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:405:70)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                                ((anon_class_1_0_00000001 *)&local_1918,
                                 (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:405:70)>
                                  *)local_2128,
                                 (tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&> *)
                                 local_2148,(RetType_conflict *)context_00);
              if (!bVar4) {
                bVar4 = matchit::impl::matchPatterns<$3793ad2d$>::anon_class_1_0_00000001::
                        operator()<matchit::impl::PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:406:80)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                                  ((anon_class_1_0_00000001 *)&local_1a90,
                                   (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:406:80)>
                                    *)local_2128,
                                   (tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&> *)
                                   local_2148,(RetType_conflict *)context_00);
                if (!bVar4) {
                  bVar4 = matchit::impl::matchPatterns<$3793ad2d$>::anon_class_1_0_00000001::
                          operator()<matchit::impl::PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:407:80)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                                    ((anon_class_1_0_00000001 *)&local_1b48,
                                     (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:407:80)>
                                      *)local_2128,
                                     (tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>
                                      *)local_2148,(RetType_conflict *)context_00);
                  if (!bVar4) {
                    bVar4 = matchit::impl::matchPatterns<$3793ad2d$>::anon_class_1_0_00000001::
                            operator()<matchit::impl::PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:408:90)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                                      ((anon_class_1_0_00000001 *)&local_2040,
                                       (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:408:90)>
                                        *)local_2128,
                                       (tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>
                                        *)local_2148,(RetType_conflict *)context_00);
                    if (!bVar4) {
                      bVar4 = matchit::impl::matchPatterns<$3793ad2d$>::anon_class_1_0_00000001::
                              operator()<matchit::impl::PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:410:62)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                                        ((anon_class_1_0_00000001 *)&local_f80,
                                         (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:410:62)>
                                          *)local_2128,
                                         (tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>
                                          *)local_2148,(RetType_conflict *)context_00);
                      if (!bVar4) {
                        bVar4 = matchit::impl::matchPatterns<$3793ad2d$>::anon_class_1_0_00000001::
                                operator()<matchit::impl::PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:414:62)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                                          ((anon_class_1_0_00000001 *)&local_fe0,
                                           (PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:414:62)>
                                            *)local_2128,
                                           (tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>
                                            *)local_2148,(RetType_conflict *)context_00);
                        if (!bVar4) {
                          bVar4 = matchit::impl::matchPatterns<$3793ad2d$>::anon_class_1_0_00000001
                                  ::
                                  operator()<matchit::impl::PatternPair<matchit::impl::Ds<matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:419:92)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                                            ((anon_class_1_0_00000001 *)local_2108,
                                             (PatternPair<matchit::impl::Ds<matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:419:92)>
                                              *)local_2128,
                                             (tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>
                                              *)local_2148,(RetType_conflict *)context_00);
                          if (!bVar4) {
                            bVar4 = matchit::impl::matchPatterns<$3793ad2d$>::
                                    anon_class_1_0_00000001::
                                    operator()<matchit::impl::PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:423:58)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                                              (local_1888,
                                               (PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:423:58)>
                                                *)local_2148,value,(RetType_conflict *)context_00);
                            if (!bVar4) {
                              this_00 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error
                                        (this_00,"Error: no patterns got matched!");
                              __cxa_throw(this_00,&std::logic_error::typeinfo,
                                          std::logic_error::~logic_error);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  piVar3 = local_1f60;
  uVar2 = local_2148._8_8_;
  *(undefined8 *)local_1f60 = local_2148._0_8_;
  *(undefined8 *)(local_1f60 + 8) = 0;
  local_2148._8_8_ = (Expr *)0x0;
  *(undefined8 *)(local_1f60 + 8) = uVar2;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&_Stack_2080);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_20a8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)auStack_20d8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)auStack_2100);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&_Stack_1cd0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_1cf8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)((long)&(((variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                    *)local_1d38)->
                                 super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                 ).
                                 super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                 .
                                 super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                 .
                                 super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                 .
                                 super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                 .
                                 super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                 ._M_u._M_first + 0x10));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)auStack_1d50);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_b08.
                          super__Head_base<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
                          ._M_head_impl.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_b08.
                          super__Head_base<0UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_b08.
                          super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
                          ._M_head_impl.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_b08.
                          super__Tuple_impl<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_df8.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_df8.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_da0.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_da0.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_fd0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_1138);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_1188);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)&local_d48.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_12a0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_f70);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_1098);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_10e8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)&local_cf8.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_1270);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_1058.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_c30);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_c98);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_830.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_a58);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_1240.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_b60);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_bc8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_7c8.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_a10);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_eb8.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_f20.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_690.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
                          .
                          super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
                          ._M_head_impl.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_690.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
                          ._M_head_impl.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_400.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
                          .
                          super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
                          ._M_head_impl.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_400.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_false>
                          ._M_head_impl.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_760.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_9c8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_6f8.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_980);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)local_11c8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_1870);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_12f0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_12c8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)local_e40);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)local_938);
  EVar10.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  EVar10.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)piVar3;
  return (ExprPtr)EVar10.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator+(ExprPtr const &lhs, ExprPtr const &rhs)
    {
#if VERBOSE_DEBUG
        std::cout << "operator+: " << toString(lhs) << "\t" << toString(rhs) << std::endl;
#endif // VERBOSE_DEBUG
        Id<Sum> iSl, iSr;
        Id<Integer> iil, iir;
        Id<Integer> ii1, ii2, ii3, ii4;
        Id<ExprPtr> coeff1, coeff2, rest;
        Id<PieceWise> iPieceWise;
        return match(*lhs, *rhs)(
            // clang-format off
                // basic commutative transformation
                pattern | _ | when ([&]{ return less(rhs, lhs); }) = [&] {
                    return rhs + lhs;
                },
                // basic identity transformation
                pattern | ds(as<Integer>(0), _) = expr(rhs),
                pattern | ds(_, as<Integer>(0)) = expr(lhs),
                // basic associative transformation
                pattern | ds(as<Sum>(iSl), as<Sum>(iSr)) = [&] {
                    return mergeSum(*iSl, *iSr);
                },
                pattern | ds(as<Sum>(iSl), _) = [&] {
                    return insertSum(*iSl, rhs);
                },
                pattern | ds(_, as<Sum>(iSr)) = [&] {
                    return insertSum(*iSr, lhs);
                },
                // basic distributive transformation
                pattern | ds(as<Integer>(iil), as<Integer>(iir))   = [&] { return integer(*iil + *iir); },
                pattern | ds(as<Integer>(iil), as<Fraction>(ds(ii1, ii2)))   = [&] { return simplifyRational(fraction(*iil * *ii2 + *ii1, *ii2)); },
                pattern | ds(as<Fraction>(ds(ii1, ii2)), as<Integer>(iir))   = [&] { return simplifyRational(fraction(*iir * *ii2 + *ii1, *ii2)); },
                pattern | ds(as<Fraction>(ds(ii1, ii2)), as<Fraction>(ds(ii3, ii4)))   = [&] { return simplifyRational(fraction(*ii1 * *ii4 + *ii2 * *ii3, *ii2 * *ii4)); },
                // piecewise
                pattern | ds(as<PieceWise>(iPieceWise), _) = [&]
                {
                    return transformPieceWise(*iPieceWise, [&](auto&& e) { return e + rhs; });
                },
                pattern | ds(_, as<PieceWise>(iPieceWise)) = [&]
                {
                    return transformPieceWise(*iPieceWise, [&](auto&& e) { return lhs + e; });
                },
                // basic distributive transformation
                pattern | ds(asCoeffAndRest(coeff1, rest), asCoeffAndRest(coeff2, rest)) = [&]
                {
                    return ((*coeff1) + (*coeff2)) * (*rest);
                },
                pattern | _                            = [&] { return makeSharedExprPtr(Sum{{{coeffAndTerm(*lhs).second, lhs}, {coeffAndTerm(*rhs).second, rhs}}}); }
            // clang-format on
        );
    }